

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# actor.h
# Opt level: O2

DAngle __thiscall
AActor::AngleTo(AActor *this,AActor *other,double oxofs,double oyofs,bool absolute)

{
  DVector3 *pDVar1;
  int in_ECX;
  undefined7 in_register_00000011;
  AActor *this_00;
  DVector3 *__return_storage_ptr__;
  TAngle<double> TVar2;
  DVector3 local_38;
  
  this_00 = (AActor *)CONCAT71(in_register_00000011,absolute);
  if (in_ECX == 0) {
    __return_storage_ptr__ = &local_38;
    PosRelative(__return_storage_ptr__,this_00,other);
    pDVar1 = &local_38;
  }
  else {
    __return_storage_ptr__ = &this_00->__Pos;
    pDVar1 = &this_00->__Pos;
  }
  local_38.X = oxofs + (__return_storage_ptr__->X - (other->__Pos).X);
  local_38.Y = oyofs + (pDVar1->Y - (other->__Pos).Y);
  TVar2 = VecToAngle<double>((TVector2<double> *)this);
  return (DAngle)TVar2.Degrees;
}

Assistant:

DAngle AngleTo(AActor *other, double oxofs, double oyofs, bool absolute = false) const
	{
		DVector2 otherpos = absolute ? other->Pos() : other->PosRelative(this);
		return VecToAngle(otherpos - Pos() + DVector2(oxofs, oyofs));
	}